

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

Program * __thiscall
deqp::gles31::Functional::ProgramInterfaceQueryTestCase::getAndCheckProgramDefinition
          (ProgramInterfaceQueryTestCase *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  RenderContext *pRVar3;
  ContextInfo *pCVar4;
  NotSupportedError *pNVar5;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_82;
  allocator<char> local_81;
  string local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  deUint32 local_24;
  ContextType local_20;
  byte local_19;
  Program *pPStack_18;
  bool supportsES32;
  Program *programDefinition;
  ProgramInterfaceQueryTestCase *this_local;
  
  programDefinition = (Program *)this;
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  pPStack_18 = (Program *)CONCAT44(extraout_var,iVar2);
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_20.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_24 = (deUint32)glu::ApiType::es(3,2);
  local_19 = glu::contextSupports(local_20,(ApiType)local_24);
  bVar1 = ProgramInterfaceDefinition::Program::hasStage(pPStack_18,SHADERTYPE_TESSELLATION_CONTROL);
  if (((bVar1) ||
      (bVar1 = ProgramInterfaceDefinition::Program::hasStage
                         (pPStack_18,SHADERTYPE_TESSELLATION_EVALUATION), bVar1)) &&
     ((local_19 & 1) == 0)) {
    pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_tessellation_shader");
    if (!bVar1) {
      local_5d = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Test requires GL_EXT_tessellation_shader extension",&local_49)
      ;
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_48);
      local_5d = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if (((this->m_queryTarget).propFlags == 0x20000) && ((local_19 & 1) == 0)) {
    pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_tessellation_shader");
    if (!bVar1) {
      local_82 = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Test requires GL_EXT_tessellation_shader extension",&local_81)
      ;
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_80);
      local_82 = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  bVar1 = ProgramInterfaceDefinition::Program::hasStage(pPStack_18,SHADERTYPE_GEOMETRY);
  if ((bVar1) && ((local_19 & 1) == 0)) {
    pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_geometry_shader");
    if (!bVar1) {
      local_aa = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Test requires GL_EXT_geometry_shader extension",&local_a9);
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_a8);
      local_aa = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  bVar1 = programContainsIOBlocks(pPStack_18);
  if ((bVar1) && ((local_19 & 1) == 0)) {
    pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_shader_io_blocks");
    if (!bVar1) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"Test requires GL_EXT_shader_io_blocks extension",&local_d1);
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_d0);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return pPStack_18;
}

Assistant:

const ProgramInterfaceDefinition::Program* ProgramInterfaceQueryTestCase::getAndCheckProgramDefinition (void)
{
	const ProgramInterfaceDefinition::Program* programDefinition = getProgramDefinition();
	DE_ASSERT(programDefinition->isValid());

	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (programDefinition->hasStage(glu::SHADERTYPE_TESSELLATION_CONTROL) ||
		programDefinition->hasStage(glu::SHADERTYPE_TESSELLATION_EVALUATION))
	{
		if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
			throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	}

	// Testing IS_PER_PATCH as a part of a larger set is ok, since the extension is checked
	// before query. However, we don't want IS_PER_PATCH-specific tests to become noop and pass.
	if (m_queryTarget.propFlags == PROGRAMRESOURCEPROP_IS_PER_PATCH)
	{
		if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
			throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	}

	if (programDefinition->hasStage(glu::SHADERTYPE_GEOMETRY))
	{
		if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
			throw tcu::NotSupportedError("Test requires GL_EXT_geometry_shader extension");
	}

	if (programContainsIOBlocks(programDefinition))
	{
		if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_shader_io_blocks"))
			throw tcu::NotSupportedError("Test requires GL_EXT_shader_io_blocks extension");
	}

	return programDefinition;
}